

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_RemoveInitBias(void)

{
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = pManMR->vInitConstraints;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      pObj = *pVVar1->pArray[lVar2];
      *(undefined8 *)pVVar1->pArray[lVar2] = 0;
      if (pObj != (Abc_Obj_t *)0x0) {
        Abc_NtkDeleteObj(pObj);
      }
      lVar2 = lVar2 + 1;
      pVVar1 = pManMR->vInitConstraints;
    } while (lVar2 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Abc_FlowRetime_RemoveInitBias( ) {
  // Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Obj_t *pBiasNode;
  InitConstraint_t *pConstraint;
  int i;

  Vec_PtrForEachEntry( InitConstraint_t *, pManMR->vInitConstraints, pConstraint, i ) {
    pBiasNode = pConstraint->pBiasNode;
    pConstraint->pBiasNode = NULL;

    if (pBiasNode)
      Abc_NtkDeleteObj(pBiasNode);
  }
}